

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

string * configDir_abi_cxx11_(void)

{
  string *in_RDI;
  string userDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  
  getUserDir_abi_cxx11_();
  std::__cxx11::string::string((string *)&local_50,local_30);
  path<std::__cxx11::string,char_const*>(in_RDI,&local_50,".sshba");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string configDir() {
    std::string userDir = getUserDir();
    return path(userDir, ".sshba");
}